

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O3

void __thiscall
capnp::compiler::NodeTranslator::compileNode(NodeTranslator *this,Reader decl,Builder builder)

{
  Reader nestedDecls;
  Reader annotations;
  Reader members;
  byte bVar1;
  Which parentKind;
  PointerType PVar2;
  WirePointer WVar3;
  BrandScope *pBVar4;
  unsigned_long i;
  ulong uVar5;
  SegmentReader *pSVar6;
  ulong uVar7;
  size_t sVar8;
  CapTableReader *pCVar9;
  char *pcVar10;
  WirePointer *pWVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  Reader RVar16;
  StringPtr targetsFlagName;
  Fault f;
  BuilderFor<capnp::schema::Node::SourceInfo> di;
  Reader genericParams;
  StructReader local_208;
  undefined1 local_1d8 [40];
  NodeTranslator *local_1b0;
  PointerReader local_1a8;
  DuplicateNameDetector local_180;
  ListReader local_148;
  StructBuilder local_118;
  ListReader local_f0;
  ListReader local_c0;
  ListReader local_90;
  ListReader local_60;
  
  local_180.errorReporter = this->errorReporter;
  local_180.names._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_180.names._M_t._M_impl.super__Rb_tree_header._M_header;
  local_180.names._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_180.names._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_180.names._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_208.data = decl._reader.pointers + 2;
  if (decl._reader.pointerCount < 3) {
    local_208.data = (WirePointer *)0x0;
  }
  uVar12 = decl._reader.segment._0_4_;
  uVar13 = decl._reader.segment._4_4_;
  uVar14 = decl._reader.capTable._0_4_;
  uVar15 = decl._reader.capTable._4_4_;
  local_208.pointers._0_4_ = decl._reader.nestingLimit;
  if (decl._reader.pointerCount < 3) {
    uVar12 = 0;
    uVar13 = 0;
    uVar14 = 0;
    uVar15 = 0;
    local_208.pointers._0_4_ = 0x7fffffff;
  }
  local_208.segment = (SegmentReader *)CONCAT44(uVar13,uVar12);
  local_208.capTable = (CapTableReader *)CONCAT44(uVar15,uVar14);
  local_180.names._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_180.names._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  _::PointerReader::getList(&local_148,(PointerReader *)&local_208,INLINE_COMPOSITE,(word *)0x0);
  if (decl._reader.dataSize < 0x20) {
    parentKind = FILE;
  }
  else {
    parentKind = *(Which *)((long)decl._reader.data + 2);
  }
  uVar12 = local_148._36_4_;
  nestedDecls.reader.capTable._0_4_ = (int)local_148.capTable;
  nestedDecls.reader.segment = local_148.segment;
  nestedDecls.reader.capTable._4_4_ = (int)((ulong)local_148.capTable >> 0x20);
  nestedDecls.reader.ptr._0_4_ = (int)local_148.ptr;
  nestedDecls.reader.ptr._4_4_ = (int)((ulong)local_148.ptr >> 0x20);
  nestedDecls.reader.elementCount = local_148.elementCount;
  nestedDecls.reader.step = local_148.step;
  nestedDecls.reader.structDataSize = local_148.structDataSize;
  nestedDecls.reader.structPointerCount = (short)uVar12;
  nestedDecls.reader.elementSize = (char)((uint)uVar12 >> 0x10);
  nestedDecls.reader._39_1_ = (char)((uint)uVar12 >> 0x18);
  nestedDecls.reader.nestingLimit = local_148.nestingLimit;
  nestedDecls.reader._44_4_ = local_148._44_4_;
  DuplicateNameDetector::check(&local_180,nestedDecls,parentKind);
  std::
  _Rb_tree<kj::StringPtr,_std::pair<const_kj::StringPtr,_capnp::compiler::LocatedText::Reader>,_std::_Select1st<std::pair<const_kj::StringPtr,_capnp::compiler::LocatedText::Reader>_>,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_capnp::compiler::LocatedText::Reader>_>_>
  ::~_Rb_tree(&local_180.names._M_t);
  local_208.data = decl._reader.pointers + 7;
  if (decl._reader.pointerCount < 8) {
    local_208.data = (WirePointer *)0x0;
  }
  uVar12 = decl._reader.segment._0_4_;
  uVar13 = decl._reader.segment._4_4_;
  uVar14 = decl._reader.capTable._0_4_;
  uVar15 = decl._reader.capTable._4_4_;
  local_208.pointers._0_4_ = decl._reader.nestingLimit;
  if (decl._reader.pointerCount < 8) {
    uVar12 = 0;
    uVar13 = 0;
    uVar14 = 0;
    uVar15 = 0;
    local_208.pointers._0_4_ = 0x7fffffff;
  }
  local_208.segment = (SegmentReader *)CONCAT44(uVar13,uVar12);
  local_208.capTable = (CapTableReader *)CONCAT44(uVar15,uVar14);
  _::PointerReader::getList
            ((ListReader *)&local_180,(PointerReader *)&local_208,INLINE_COMPOSITE,(word *)0x0);
  if ((ElementCount)local_180.names._M_t._M_impl.super__Rb_tree_header._M_header._M_parent != 0) {
    local_208.data = builder._builder.pointers + 5;
    local_208.segment = &(builder._builder.segment)->super_SegmentReader;
    local_208.capTable = &(builder._builder.capTable)->super_CapTableReader;
    local_1b0 = this;
    _::PointerBuilder::initStructList
              ((ListBuilder *)local_1d8,(PointerBuilder *)&local_208,
               (ElementCount)local_180.names._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
               (StructSize)0x10000);
    uVar7 = (ulong)local_180.names._M_t._M_impl.super__Rb_tree_header._M_header._M_parent &
            0xffffffff;
    this = local_1b0;
    if (uVar7 != 0) {
      uVar5 = 0;
      do {
        _::ListBuilder::getStructElement(&local_118,(ListBuilder *)local_1d8,(ElementCount)uVar5);
        _::ListReader::getStructElement(&local_208,(ListReader *)&local_180,(ElementCount)uVar5);
        local_1a8.pointer =
             (WirePointer *)CONCAT44(local_208.pointers._4_4_,(int)local_208.pointers);
        local_1a8.nestingLimit = local_208.nestingLimit;
        if (local_208.pointerCount == 0) {
          local_1a8.pointer = (WirePointer *)0x0;
          local_1a8.nestingLimit = 0x7fffffff;
        }
        uVar12 = 0;
        uVar13 = 0;
        uVar14 = 0;
        uVar15 = 0;
        if (local_208.pointerCount != 0) {
          uVar12 = local_208.segment._0_4_;
          uVar13 = local_208.segment._4_4_;
          uVar14 = local_208.capTable._0_4_;
          uVar15 = local_208.capTable._4_4_;
        }
        local_1a8.segment = (SegmentReader *)CONCAT44(uVar13,uVar12);
        local_1a8.capTable = (CapTableReader *)CONCAT44(uVar15,uVar14);
        RVar16 = _::PointerReader::getBlob<capnp::Text>(&local_1a8,(void *)0x0,0);
        local_1a8.segment = &(local_118.segment)->super_SegmentReader;
        local_1a8.capTable = &(local_118.capTable)->super_CapTableReader;
        local_1a8.pointer = local_118.pointers;
        _::PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&local_1a8,RVar16);
        uVar5 = uVar5 + 1;
        this = local_1b0;
      } while (uVar7 != uVar5);
    }
  }
  pBVar4 = (this->localBrand).ptr;
  bVar1 = 1;
  do {
    if (pBVar4->leafParamCount != 0) goto LAB_001635b1;
    pBVar4 = (pBVar4->parent).ptr.ptr;
  } while (pBVar4 != (BrandScope *)0x0);
  bVar1 = 0;
LAB_001635b1:
  *(byte *)((long)builder._builder.data + 0x24) =
       *(byte *)((long)builder._builder.data + 0x24) & 0xfe | bVar1;
  sVar8 = 0xc;
  pcVar10 = "targetsFile";
  if (0x1f < decl._reader.dataSize) {
    switch(*(undefined2 *)((long)decl._reader.data + 2)) {
    case 0:
      break;
    default:
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[32]>
                ((Fault *)&local_208,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/node-translator.c++"
                 ,0x5c7,FAILED,(char *)0x0,"\"This Declaration is not a node.\"",
                 (char (*) [32])"This Declaration is not a node.");
      kj::_::Debug::Fault::fatal((Fault *)&local_208);
    case 2:
      *(undefined2 *)((long)builder._builder.data + 0xc) = 4;
      local_208.data = builder._builder.pointers + 3;
      local_208.segment = &(builder._builder.segment)->super_SegmentReader;
      local_208.capTable = &(builder._builder.capTable)->super_CapTableReader;
      _::PointerBuilder::clear((PointerBuilder *)&local_208);
      local_208.data = builder._builder.pointers + 4;
      local_208.segment = &(builder._builder.segment)->super_SegmentReader;
      local_208.capTable = &(builder._builder.capTable)->super_CapTableReader;
      _::PointerBuilder::clear((PointerBuilder *)&local_208);
      compileConst(this,(Reader)decl._reader,(Builder)builder._builder);
      sVar8 = 0xd;
      pcVar10 = "targetsConst";
      break;
    case 3:
      local_208.data = decl._reader.pointers + 2;
      if (decl._reader.pointerCount < 3) {
        local_208.data = (WirePointer *)0x0;
      }
      uVar12 = decl._reader.segment._0_4_;
      uVar13 = decl._reader.segment._4_4_;
      uVar14 = decl._reader.capTable._0_4_;
      uVar15 = decl._reader.capTable._4_4_;
      local_208.pointers._0_4_ = decl._reader.nestingLimit;
      if (decl._reader.pointerCount < 3) {
        uVar12 = 0;
        uVar13 = 0;
        uVar14 = 0;
        uVar15 = 0;
        local_208.pointers._0_4_ = 0x7fffffff;
      }
      local_208.segment = (SegmentReader *)CONCAT44(uVar13,uVar12);
      local_208.capTable = (CapTableReader *)CONCAT44(uVar15,uVar14);
      _::PointerReader::getList(&local_60,(PointerReader *)&local_208,INLINE_COMPOSITE,(word *)0x0);
      compileEnum(this);
      pcVar10 = "targetsEnum";
      break;
    case 5:
      local_208.data = decl._reader.pointers + 2;
      if (decl._reader.pointerCount < 3) {
        local_208.data = (WirePointer *)0x0;
      }
      uVar12 = decl._reader.segment._0_4_;
      uVar13 = decl._reader.segment._4_4_;
      uVar14 = decl._reader.capTable._0_4_;
      uVar15 = decl._reader.capTable._4_4_;
      local_208.pointers._0_4_ = decl._reader.nestingLimit;
      if (decl._reader.pointerCount < 3) {
        uVar12 = 0;
        uVar13 = 0;
        uVar14 = 0;
        uVar15 = 0;
        local_208.pointers._0_4_ = 0x7fffffff;
      }
      local_208.segment = (SegmentReader *)CONCAT44(uVar13,uVar12);
      local_208.capTable = (CapTableReader *)CONCAT44(uVar15,uVar14);
      _::PointerReader::getList(&local_90,(PointerReader *)&local_208,INLINE_COMPOSITE,(word *)0x0);
      compileStruct(this);
      sVar8 = 0xe;
      pcVar10 = "targetsStruct";
      break;
    case 9:
      local_208.data = decl._reader.pointers + 2;
      if (decl._reader.pointerCount < 3) {
        local_208.data = (WirePointer *)0x0;
      }
      uVar12 = decl._reader.segment._0_4_;
      uVar13 = decl._reader.segment._4_4_;
      uVar14 = decl._reader.capTable._0_4_;
      uVar15 = decl._reader.capTable._4_4_;
      local_208.pointers._0_4_ = decl._reader.nestingLimit;
      if (decl._reader.pointerCount < 3) {
        uVar12 = 0;
        uVar13 = 0;
        uVar14 = 0;
        uVar15 = 0;
        local_208.pointers._0_4_ = 0x7fffffff;
      }
      local_208.segment = (SegmentReader *)CONCAT44(uVar13,uVar12);
      local_208.capTable = (CapTableReader *)CONCAT44(uVar15,uVar14);
      _::PointerReader::getList(&local_c0,(PointerReader *)&local_208,INLINE_COMPOSITE,(word *)0x0);
      members.reader.capTable = local_c0.capTable;
      members.reader.segment = local_c0.segment;
      members.reader.ptr = local_c0.ptr;
      members.reader.elementCount = local_c0.elementCount;
      members.reader.step = local_c0.step;
      members.reader.structDataSize = local_c0.structDataSize;
      members.reader.structPointerCount = local_c0.structPointerCount;
      members.reader.elementSize = local_c0.elementSize;
      members.reader._39_1_ = local_c0._39_1_;
      members.reader.nestingLimit = local_c0.nestingLimit;
      members.reader._44_4_ = local_c0._44_4_;
      compileInterface(this,(Reader)decl._reader,members,builder);
      sVar8 = 0x11;
      pcVar10 = "targetsInterface";
      break;
    case 0xb:
      *(undefined2 *)((long)builder._builder.data + 0xc) = 5;
      *(undefined1 *)((long)builder._builder.data + 0xe) = 0;
      *(byte *)((long)builder._builder.data + 0xf) =
           *(byte *)((long)builder._builder.data + 0xf) & 0xf0;
      local_208.data = builder._builder.pointers + 3;
      local_208.segment = &(builder._builder.segment)->super_SegmentReader;
      local_208.capTable = &(builder._builder.capTable)->super_CapTableReader;
      _::PointerBuilder::clear((PointerBuilder *)&local_208);
      compileAnnotation(this,(Reader)decl._reader,(Builder)builder._builder);
      sVar8 = 0x12;
      pcVar10 = "targetsAnnotation";
    }
  }
  local_208.data = decl._reader.pointers + 3;
  if (decl._reader.pointerCount < 4) {
    local_208.data = (WirePointer *)0x0;
  }
  uVar12 = decl._reader.segment._0_4_;
  uVar13 = decl._reader.segment._4_4_;
  uVar14 = decl._reader.capTable._0_4_;
  uVar15 = decl._reader.capTable._4_4_;
  local_208.pointers._0_4_ = decl._reader.nestingLimit;
  if (decl._reader.pointerCount < 4) {
    uVar12 = 0;
    uVar13 = 0;
    uVar14 = 0;
    uVar15 = 0;
    local_208.pointers._0_4_ = 0x7fffffff;
  }
  local_208.segment = (SegmentReader *)CONCAT44(uVar13,uVar12);
  local_208.capTable = (CapTableReader *)CONCAT44(uVar15,uVar14);
  _::PointerReader::getList(&local_f0,(PointerReader *)&local_208,INLINE_COMPOSITE,(word *)0x0);
  uVar12 = local_f0._36_4_;
  annotations.reader.capTable._0_4_ = (int)local_f0.capTable;
  annotations.reader.segment = local_f0.segment;
  annotations.reader.capTable._4_4_ = (int)((ulong)local_f0.capTable >> 0x20);
  annotations.reader.ptr._0_4_ = (int)local_f0.ptr;
  annotations.reader.ptr._4_4_ = (int)((ulong)local_f0.ptr >> 0x20);
  annotations.reader.elementCount = local_f0.elementCount;
  annotations.reader.step = local_f0.step;
  annotations.reader.structDataSize = local_f0.structDataSize;
  annotations.reader.structPointerCount = (short)uVar12;
  annotations.reader.elementSize = (char)((uint)uVar12 >> 0x10);
  annotations.reader._39_1_ = (char)((uint)uVar12 >> 0x18);
  annotations.reader.nestingLimit = local_f0.nestingLimit;
  annotations.reader._44_4_ = local_f0._44_4_;
  targetsFlagName.content.size_ = sVar8;
  targetsFlagName.content.ptr = pcVar10;
  compileAnnotationApplications
            ((Orphan<capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>_> *)local_1d8,this,
             annotations,targetsFlagName);
  local_208.data = builder._builder.pointers + 2;
  local_208.segment = &(builder._builder.segment)->super_SegmentReader;
  local_208.capTable = &(builder._builder.capTable)->super_CapTableReader;
  _::PointerBuilder::adopt((PointerBuilder *)&local_208,(OrphanBuilder *)local_1d8);
  if ((SegmentBuilder *)local_1d8._8_8_ != (SegmentBuilder *)0x0) {
    _::OrphanBuilder::euthanize((OrphanBuilder *)local_1d8);
  }
  _::OrphanBuilder::asStruct
            ((StructBuilder *)local_1d8,&(this->sourceInfo).builder,(StructSize)0x20001);
  _::OrphanBuilder::asStructReader(&local_208,&(this->wipNode).builder,(StructSize)0x60005);
  if (local_208.dataSize < 0x40) {
    WVar3.offsetAndKind.value = 0;
    WVar3.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
  }
  else {
    WVar3 = *local_208.data;
  }
  *(WirePointer *)local_1d8._16_8_ = WVar3;
  if (decl._reader.pointerCount < 5) {
    local_208.segment = (SegmentReader *)0x0;
    local_208.capTable = (CapTableReader *)0x0;
    local_208.data = (void *)0x0;
    local_208.pointers._0_4_ = 0x7fffffff;
    PVar2 = _::PointerReader::getPointerType((PointerReader *)&local_208);
    if (PVar2 == NULL_) {
      return;
    }
    pCVar9 = (CapTableReader *)0x0;
    decl._reader.nestingLimit = 0x7fffffff;
    pWVar11 = (WirePointer *)0x0;
    pSVar6 = (SegmentReader *)0x0;
  }
  else {
    pSVar6 = decl._reader.segment;
    pCVar9 = decl._reader.capTable;
    pWVar11 = decl._reader.pointers + 4;
    local_208.pointers._0_4_ = decl._reader.nestingLimit;
    local_208.segment = pSVar6;
    local_208.capTable = pCVar9;
    local_208.data = pWVar11;
    PVar2 = _::PointerReader::getPointerType((PointerReader *)&local_208);
    if (PVar2 == NULL_) {
      return;
    }
  }
  local_208.segment = pSVar6;
  local_208.capTable = pCVar9;
  local_208.data = pWVar11;
  local_208.pointers._0_4_ = decl._reader.nestingLimit;
  RVar16 = _::PointerReader::getBlob<capnp::Text>((PointerReader *)&local_208,(void *)0x0,0);
  local_208.segment = (SegmentReader *)local_1d8._0_8_;
  local_208.capTable = (CapTableReader *)local_1d8._8_8_;
  local_208.data = (void *)local_1d8._24_8_;
  _::PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&local_208,RVar16);
  return;
}

Assistant:

void NodeTranslator::compileNode(Declaration::Reader decl, schema::Node::Builder builder) {
  DuplicateNameDetector(errorReporter)
      .check(decl.getNestedDecls(), decl.which());

  auto genericParams = decl.getParameters();
  if (genericParams.size() > 0) {
    auto paramsBuilder = builder.initParameters(genericParams.size());
    for (auto i: kj::indices(genericParams)) {
      paramsBuilder[i].setName(genericParams[i].getName());
    }
  }

  builder.setIsGeneric(localBrand->isGeneric());

  kj::StringPtr targetsFlagName;

  switch (decl.which()) {
    case Declaration::FILE:
      targetsFlagName = "targetsFile";
      break;
    case Declaration::CONST:
      compileConst(decl.getConst(), builder.initConst());
      targetsFlagName = "targetsConst";
      break;
    case Declaration::ANNOTATION:
      compileAnnotation(decl.getAnnotation(), builder.initAnnotation());
      targetsFlagName = "targetsAnnotation";
      break;
    case Declaration::ENUM:
      compileEnum(decl.getEnum(), decl.getNestedDecls(), builder);
      targetsFlagName = "targetsEnum";
      break;
    case Declaration::STRUCT:
      compileStruct(decl.getStruct(), decl.getNestedDecls(), builder);
      targetsFlagName = "targetsStruct";
      break;
    case Declaration::INTERFACE:
      compileInterface(decl.getInterface(), decl.getNestedDecls(), builder);
      targetsFlagName = "targetsInterface";
      break;

    default:
      KJ_FAIL_REQUIRE("This Declaration is not a node.");
      break;
  }

  builder.adoptAnnotations(compileAnnotationApplications(decl.getAnnotations(), targetsFlagName));

  auto di = sourceInfo.get();
  di.setId(wipNode.getReader().getId());
  if (decl.hasDocComment()) {
    di.setDocComment(decl.getDocComment());
  }
}